

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O2

Image * LoadImageRaw(Image *__return_storage_ptr__,char *fileName,int width,int height,int format,
                    int headerSize)

{
  uint uVar1;
  uint in_EAX;
  uint uVar2;
  uchar *__ptr;
  void *__dest;
  uint dataSize;
  undefined8 local_38;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  local_38 = (ulong)in_EAX;
  __ptr = LoadFileData(fileName,(uint *)((long)&local_38 + 4));
  if (__ptr != (uchar *)0x0) {
    uVar2 = GetPixelDataSize(width,height,format);
    local_38 = CONCAT44(local_38._4_4_,format);
    uVar1 = 0;
    if (0 < headerSize) {
      uVar1 = headerSize;
    }
    __dest = malloc((ulong)uVar2);
    __return_storage_ptr__->data = __dest;
    memcpy(__dest,__ptr + uVar1,(ulong)uVar2);
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->mipmaps = 1;
    __return_storage_ptr__->format = (int)local_38;
    free(__ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

Image LoadImageRaw(const char *fileName, int width, int height, int format, int headerSize)
{
    Image image = { 0 };

    unsigned int dataSize = 0;
    unsigned char *fileData = LoadFileData(fileName, &dataSize);

    if (fileData != NULL)
    {
        unsigned char *dataPtr = fileData;
        unsigned int size = GetPixelDataSize(width, height, format);

        if (headerSize > 0) dataPtr += headerSize;

        image.data = RL_MALLOC(size);      // Allocate required memory in bytes
        memcpy(image.data, dataPtr, size); // Copy required data to image
        image.width = width;
        image.height = height;
        image.mipmaps = 1;
        image.format = format;

        RL_FREE(fileData);
    }

    return image;
}